

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O2

bool __thiscall
sptk::MelFilterBankAnalysis::GetCenterFrequencies
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *center_frequencies)

{
  bool bVar1;
  size_type __new_size;
  int m;
  long lVar2;
  double dVar3;
  
  bVar1 = (bool)(center_frequencies != (vector<double,_std::allocator<double>_> *)0x0 &
                this->is_valid_);
  if (bVar1 == true) {
    __new_size = (long)this->num_channel_ + 1;
    if ((long)(center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(center_frequencies,__new_size);
    }
    for (lVar2 = 0; lVar2 <= this->num_channel_; lVar2 = lVar2 + 1) {
      dVar3 = expm1((this->center_frequencies_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2] / 1127.0);
      (center_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar2] = dVar3 * 700.0;
    }
  }
  return bVar1;
}

Assistant:

bool MelFilterBankAnalysis::GetCenterFrequencies(
    std::vector<double>* center_frequencies) const {
  if (!is_valid_ || NULL == center_frequencies) {
    return false;
  }

  if (center_frequencies->size() !=
      static_cast<std::size_t>(num_channel_ + 1)) {
    center_frequencies->resize(num_channel_ + 1);
  }

  for (int m(0); m <= num_channel_; ++m) {
    (*center_frequencies)[m] = MelToHz(center_frequencies_[m]);
  }

  return true;
}